

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O0

DdNode * cuddBddNPAndRecur(DdManager *manager,DdNode *f,DdNode *g)

{
  DdHalfWord index_00;
  DdManager *pDVar1;
  DdManager *pDVar2;
  DdNode *pDVar3;
  DdNode *E;
  DdNode *pDVar4;
  bool bVar5;
  DdNode *d;
  uint index;
  uint topg;
  uint topf;
  DdNode *e;
  DdNode *t;
  DdNode *r;
  DdNode *one;
  DdNode *ge;
  DdNode *gt;
  DdNode *G;
  DdNode *fe;
  DdNode *ft;
  DdNode *F;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  manager_local = (DdManager *)manager->one;
  pDVar1 = (DdManager *)((ulong)f & 0xfffffffffffffffe);
  pDVar2 = (DdManager *)((ulong)g & 0xfffffffffffffffe);
  if (pDVar1 == pDVar2) {
    if (f != g) {
      manager_local = (DdManager *)((ulong)manager_local ^ 1);
    }
  }
  else if (pDVar2 == manager_local) {
    bVar5 = (DdManager *)g == manager_local;
    manager_local = (DdManager *)g;
    if (bVar5) {
      manager_local = (DdManager *)f;
    }
  }
  else {
    bVar5 = pDVar1 != manager_local;
    manager_local = (DdManager *)f;
    if ((bVar5) &&
       ((((pDVar1->sentinel).ref == 1 && ((pDVar2->sentinel).ref == 1)) ||
        (manager_local = (DdManager *)cuddCacheLookup2(manager,Cudd_bddNPAnd,f,g),
        manager_local == (DdManager *)0x0)))) {
      if ((uint)manager->perm[(pDVar2->sentinel).index] <
          (uint)manager->perm[(pDVar1->sentinel).index]) {
        if (((ulong)g & 1) == 0) {
          ge = (DdNode *)((ulong)(g->type).kids.T ^ 1);
          one = (DdNode *)((ulong)(g->type).kids.E ^ 1);
        }
        else {
          ge = (pDVar2->sentinel).type.kids.T;
          one = (pDVar2->sentinel).type.kids.E;
        }
        pDVar3 = cuddBddAndRecur(manager,ge,one);
        if (pDVar3 == (DdNode *)0x0) {
          manager_local = (DdManager *)0x0;
        }
        else {
          pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          manager_local = (DdManager *)cuddBddNPAndRecur(manager,f,pDVar3);
          if (manager_local == (DdManager *)0x0) {
            Cudd_IterDerefBdd(manager,pDVar3);
            manager_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) + 1;
            Cudd_IterDerefBdd(manager,pDVar3);
            cuddCacheInsert2(manager,Cudd_bddNPAnd,f,g,(DdNode *)manager_local);
            *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) + -1;
          }
        }
      }
      else {
        index_00 = (pDVar1->sentinel).index;
        fe = (pDVar1->sentinel).type.kids.T;
        G = (pDVar1->sentinel).type.kids.E;
        if (((ulong)f & 1) != 0) {
          fe = (DdNode *)((ulong)fe ^ 1);
          G = (DdNode *)((ulong)G ^ 1);
        }
        one = g;
        ge = g;
        if (manager->perm[(pDVar2->sentinel).index] == manager->perm[(pDVar1->sentinel).index]) {
          ge = (pDVar2->sentinel).type.kids.T;
          one = (pDVar2->sentinel).type.kids.E;
          if (((ulong)g & 1) != 0) {
            ge = (DdNode *)((ulong)ge ^ 1);
            one = (DdNode *)((ulong)one ^ 1);
          }
        }
        pDVar3 = cuddBddAndRecur(manager,fe,ge);
        if (pDVar3 == (DdNode *)0x0) {
          manager_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          E = cuddBddAndRecur(manager,G,one);
          if (E == (DdNode *)0x0) {
            Cudd_IterDerefBdd(manager,pDVar3);
            manager_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
            t = pDVar3;
            if (pDVar3 != E) {
              if (((ulong)pDVar3 & 1) == 0) {
                t = cuddUniqueInter(manager,index_00,pDVar3,E);
                if (t == (DdNode *)0x0) {
                  Cudd_IterDerefBdd(manager,pDVar3);
                  Cudd_IterDerefBdd(manager,E);
                  return (DdNode *)0x0;
                }
              }
              else {
                pDVar4 = cuddUniqueInter(manager,index_00,(DdNode *)((ulong)pDVar3 ^ 1),
                                         (DdNode *)((ulong)E ^ 1));
                if (pDVar4 == (DdNode *)0x0) {
                  Cudd_IterDerefBdd(manager,pDVar3);
                  Cudd_IterDerefBdd(manager,E);
                  return (DdNode *)0x0;
                }
                t = (DdNode *)((ulong)pDVar4 ^ 1);
              }
            }
            *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
            *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + -1;
            if (((pDVar1->sentinel).ref != 1) || ((pDVar2->sentinel).ref != 1)) {
              cuddCacheInsert2(manager,Cudd_bddNPAnd,f,g,t);
            }
            manager_local = (DdManager *)t;
          }
        }
      }
    }
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode *
cuddBddNPAndRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g)
{
    DdNode *F, *ft, *fe, *G, *gt, *ge;
    DdNode *one, *r, *t, *e;
    unsigned int topf, topg, index;

    statLine(manager);
    one = DD_ONE(manager);

    /* Terminal cases. */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    if (F == G) {
        if (f == g) return(one);
        else return(Cudd_Not(one));
    }
    if (G == one) {
        if (g == one) return(f);
        else return(g);
    }
    if (F == one) {
        return(f);
    }

    /* At this point f and g are not constant. */
    /* Check cache. */
    if (F->ref != 1 || G->ref != 1) {
        r = cuddCacheLookup2(manager, Cudd_bddNPAnd, f, g);
        if (r != NULL) return(r);
    }

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    topf = manager->perm[F->index];
    topg = manager->perm[G->index];

    if (topg < topf) {  /* abstract top variable from g */
        DdNode *d;

        /* Find complements of cofactors of g. */
        if (Cudd_IsComplement(g)) {
            gt = cuddT(G);
            ge = cuddE(G);
        } else {
            gt = Cudd_Not(cuddT(g));
            ge = Cudd_Not(cuddE(g));
        }
        /* Take the OR by applying DeMorgan. */
        d = cuddBddAndRecur(manager, gt, ge);
        if (d == NULL) return(NULL);
        d = Cudd_Not(d);
        cuddRef(d);
        r = cuddBddNPAndRecur(manager, f, d);
        if (r == NULL) {
            Cudd_IterDerefBdd(manager, d);
            return(NULL);
        }
        cuddRef(r);
        Cudd_IterDerefBdd(manager, d);
        cuddCacheInsert2(manager, Cudd_bddNPAnd, f, g, r);
        cuddDeref(r);
        return(r);
    }

    /* Compute cofactors. */
    index = F->index;
    ft = cuddT(F);
    fe = cuddE(F);
    if (Cudd_IsComplement(f)) {
      ft = Cudd_Not(ft);
      fe = Cudd_Not(fe);
    }

    if (topg == topf) {
        gt = cuddT(G);
        ge = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gt = Cudd_Not(gt);
            ge = Cudd_Not(ge);
        }
    } else {
        gt = ge = g;
    }

    t = cuddBddAndRecur(manager, ft, gt);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddBddAndRecur(manager, fe, ge);
    if (e == NULL) {
        Cudd_IterDerefBdd(manager, t);
        return(NULL);
    }
    cuddRef(e);

    if (t == e) {
        r = t;
    } else {
        if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(manager,(int)index,Cudd_Not(t),Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(manager,(int)index,t,e);
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
        }
    }
    cuddDeref(e);
    cuddDeref(t);
    if (F->ref != 1 || G->ref != 1)
        cuddCacheInsert2(manager, Cudd_bddNPAnd, f, g, r);
    return(r);

}